

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O2

Real NormHelper_NVector_MultiFab(N_Vector x,N_Vector w,N_Vector id,int use_id,bool rms)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int *piVar4;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int k;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int j;
  long lVar19;
  long lVar20;
  Real RVar21;
  double local_220;
  int local_214;
  Box local_1b0;
  FabArray<amrex::FArrayBox> *local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  ulong local_168;
  Array4<const_double> local_160;
  Array4<const_double> local_120;
  Array4<const_double> local_e0;
  IntVect local_a0;
  MFIter mfi;
  
  piVar4 = (int *)x->content;
  this = *(FabArray<amrex::FArrayBox> **)(piVar4 + 2);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)w->content + 8);
  if (use_id == 0) {
    uVar3 = (this->super_FabArrayBase).n_comp;
    local_214 = *piVar4;
    local_1b0.smallend.vect[0] = 0;
    local_1b0.smallend.vect[1] = 0;
    local_1b0.smallend.vect[2] = 0;
    amrex::MFIter::MFIter(&mfi,&this->super_FabArrayBase,true);
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    local_220 = 0.0;
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::growntilebox((Box *)&local_e0,&mfi,&local_1b0.smallend);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_120,this,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_160,this_00,&mfi);
      lVar5 = (long)(int)local_e0.p;
      lVar16 = (long)local_e0.p._4_4_;
      lVar13 = (long)(int)local_e0.jstride;
      lVar12 = lVar5 * 8 +
               (lVar16 - local_160.begin.y) * local_160.jstride * 8 +
               (lVar13 - local_160.begin.z) * local_160.kstride * 8 + (long)local_160.begin.x * -8 +
               (long)local_160.p;
      lVar11 = (lVar16 - local_120.begin.y) * local_120.jstride * 8 +
               (lVar13 - local_120.begin.z) * local_120.kstride * 8 + lVar5 * 8 +
               (long)local_120.begin.x * -8 + (long)local_120.p;
      for (uVar6 = 0; lVar17 = lVar11, lVar8 = lVar13, lVar10 = lVar12, uVar6 != uVar3;
          uVar6 = uVar6 + 1) {
        for (; lVar7 = lVar16, lVar15 = lVar17, lVar9 = lVar10, lVar8 <= local_e0.kstride._4_4_;
            lVar8 = lVar8 + 1) {
          for (; lVar7 <= (int)local_e0.kstride; lVar7 = lVar7 + 1) {
            for (lVar18 = 0; lVar5 + lVar18 <= (long)local_e0.jstride._4_4_; lVar18 = lVar18 + 1) {
              dVar1 = *(double *)(lVar15 + lVar18 * 8);
              dVar2 = *(double *)(lVar9 + lVar18 * 8);
              local_220 = local_220 + dVar1 * dVar1 * dVar2 * dVar2;
            }
            lVar15 = lVar15 + local_120.jstride * 8;
            lVar9 = lVar9 + local_160.jstride * 8;
          }
          lVar17 = lVar17 + local_120.kstride * 8;
          lVar10 = lVar10 + local_160.kstride * 8;
        }
        lVar12 = lVar12 + local_160.nstride * 8;
        lVar11 = lVar11 + local_120.nstride * 8;
      }
      amrex::MFIter::operator++(&mfi);
    }
  }
  else {
    local_190 = *(FabArray<amrex::FArrayBox> **)((long)id->content + 8);
    uVar3 = (this->super_FabArrayBase).n_comp;
    local_214 = *piVar4;
    local_a0.vect[0] = 0;
    local_a0.vect[1] = 0;
    local_a0.vect[2] = 0;
    amrex::MFIter::MFIter(&mfi,&this->super_FabArrayBase,true);
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    local_168 = (ulong)uVar3;
    local_220 = 0.0;
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::growntilebox(&local_1b0,&mfi,&local_a0);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_120,this,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_160,this_00,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_e0,local_190,&mfi);
      lVar5 = (long)local_1b0.smallend.vect[0];
      lVar16 = (long)local_1b0.smallend.vect[1];
      local_170 = (long)local_1b0.smallend.vect[2];
      lVar13 = CONCAT44(local_e0.kstride._4_4_,(int)local_e0.kstride) * 8;
      lVar11 = CONCAT44(local_e0.jstride._4_4_,(int)local_e0.jstride) * 8;
      lVar17 = (lVar16 - local_160.begin.y) * local_160.jstride * 8 +
               (local_170 - local_160.begin.z) * local_160.kstride * 8 + lVar5 * 8 +
               (long)local_160.begin.x * -8 + (long)local_160.p;
      local_188 = local_160.nstride * 8;
      lVar12 = (lVar16 - local_120.begin.y) * local_120.jstride * 8 +
               (local_170 - local_120.begin.z) * local_120.kstride * 8 + lVar5 * 8 +
               (long)local_120.begin.x * -8 + (long)local_120.p;
      local_180 = (lVar16 - local_e0.begin.y) * lVar11 + (local_170 - local_e0.begin.z) * lVar13 +
                  lVar5 * 8 + (long)local_e0.begin.x * -8 +
                  CONCAT44(local_e0.p._4_4_,(int)local_e0.p);
      local_178 = local_120.nstride * 8;
      for (uVar6 = 0; lVar8 = local_170, lVar10 = local_180, lVar7 = lVar12, lVar15 = lVar17,
          uVar6 != local_168; uVar6 = uVar6 + 1) {
        for (; lVar9 = lVar10, lVar18 = lVar15, lVar19 = lVar16, lVar20 = lVar7,
            lVar8 <= local_1b0.bigend.vect[2]; lVar8 = lVar8 + 1) {
          for (; lVar19 <= local_1b0.bigend.vect[1]; lVar19 = lVar19 + 1) {
            for (lVar14 = 0; lVar5 + lVar14 <= (long)local_1b0.bigend.vect[0]; lVar14 = lVar14 + 1)
            {
              if (0.0 < *(double *)(lVar9 + lVar14 * 8)) {
                dVar1 = *(double *)(lVar20 + lVar14 * 8);
                dVar2 = *(double *)(lVar18 + lVar14 * 8);
                local_220 = local_220 + dVar1 * dVar1 * dVar2 * dVar2;
              }
            }
            lVar9 = lVar9 + lVar11;
            lVar18 = lVar18 + local_160.jstride * 8;
            lVar20 = lVar20 + local_120.jstride * 8;
          }
          lVar10 = lVar10 + lVar13;
          lVar7 = lVar7 + local_120.kstride * 8;
          lVar15 = lVar15 + local_160.kstride * 8;
        }
        lVar17 = lVar17 + local_188;
        lVar12 = lVar12 + local_178;
      }
      amrex::MFIter::operator++(&mfi);
    }
  }
  amrex::MFIter::~MFIter(&mfi);
  if (rms) {
    local_220 = local_220 / (double)local_214;
  }
  RVar21 = 0.0;
  if (0.0 < local_220) {
    if (local_220 < 0.0) {
      RVar21 = sqrt(local_220);
    }
    else {
      RVar21 = SQRT(local_220);
    }
  }
  return RVar21;
}

Assistant:

amrex::Real NormHelper_NVector_MultiFab(N_Vector x, N_Vector w, N_Vector id, int use_id, bool rms)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    //Call mf_y=mf_w is the MultiFab* from the N_Vector w
    MultiFab *mf_y = amrex::sundials::getMFptr(w);
    MultiFab *mf_id = use_id ? amrex::sundials::getMFptr(id) : NULL;
    sunindextype numcomp = mf_x->nComp();
    sunindextype N = amrex::sundials::N_VGetLength_MultiFab(x);
    bool local = true;
    IntVect nghost = amrex::IntVect::TheZeroVector();
    Real sum = 0;
    int xcomp = 0;
    int ycomp = 0;

    // ghost cells not included
    if(use_id)
        sum = amrex::NormHelper(*mf_id,
                                *mf_x, xcomp,
                                *mf_y, ycomp,
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real m) -> amrex::Real { return m > amrex::Real(0.0); },
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real x, amrex::Real y) -> amrex::Real { return x*x*y*y; },
                                numcomp, nghost, local);
    else
        sum = amrex::NormHelper(*mf_x, xcomp,
                                *mf_y, ycomp,
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real x, amrex::Real y) -> amrex::Real { return x*x*y*y; },
                                numcomp, nghost, local);
    ParallelDescriptor::ReduceRealSum(sum);

    return rms ? SUNRsqrt(sum/N) : SUNRsqrt(sum);
}